

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error ft_add_renderer(FT_Module module)

{
  FT_Memory pFVar1;
  FT_Library pFVar2;
  FT_ListNode node_00;
  void *pvVar3;
  FT_Renderer_Class *clazz;
  FT_Renderer_conflict render;
  FT_ListNode node;
  FT_Memory pFStack_20;
  FT_Error error;
  FT_Memory memory;
  FT_Library library;
  FT_Module module_local;
  
  memory = (FT_Memory)module->library;
  pFStack_20 = ((FT_Library)memory)->memory;
  library = (FT_Library)module;
  node_00 = (FT_ListNode)ft_mem_qalloc(pFStack_20,0x18,(FT_Error *)((long)&node + 4));
  pFVar2 = library;
  if (node._4_4_ != 0) {
    return node._4_4_;
  }
  pFVar1 = library->memory;
  library->modules[0] = (FT_Module)pFVar1;
  *(undefined4 *)(library->modules + 1) = *(undefined4 *)&pFVar1[2].alloc;
  if ((pFVar1[3].free != (FT_Free_Func)0x0) && (*(long *)(pFVar1[3].free + 8) != 0)) {
    pvVar3 = (**(code **)(pFVar1[3].free + 8))(pFStack_20,(long)(library->modules + 10));
    node._4_4_ = (int)pvVar3;
    if (node._4_4_ != 0) goto LAB_002dd7d2;
    pFVar2->modules[0xb] = *(FT_Module *)(pFVar1[3].free + 0x20);
    pFVar2->modules[0xc] = (FT_Module)pFVar1[2].free;
  }
  if (*(int *)&pFVar1[2].alloc == 0x53564720) {
    pFVar2->modules[0xc] = (FT_Module)pFVar1[2].free;
  }
  node_00->data = library;
  FT_List_Add((FT_List)&memory[8].realloc,node_00);
  ft_set_current_renderer((FT_Library)memory);
LAB_002dd7d2:
  if (node._4_4_ != 0) {
    ft_mem_free(pFStack_20,node_00);
  }
  return node._4_4_;
}

Assistant:

static FT_Error
  ft_add_renderer( FT_Module  module )
  {
    FT_Library   library = module->library;
    FT_Memory    memory  = library->memory;
    FT_Error     error;
    FT_ListNode  node    = NULL;


    if ( FT_QNEW( node ) )
      goto Exit;

    {
      FT_Renderer         render = FT_RENDERER( module );
      FT_Renderer_Class*  clazz  = (FT_Renderer_Class*)module->clazz;


      render->clazz        = clazz;
      render->glyph_format = clazz->glyph_format;

      /* allocate raster object if needed */
      if ( clazz->raster_class && clazz->raster_class->raster_new )
      {
        error = clazz->raster_class->raster_new( memory, &render->raster );
        if ( error )
          goto Fail;

        render->raster_render = clazz->raster_class->raster_render;
        render->render        = clazz->render_glyph;
      }

#ifdef FT_CONFIG_OPTION_SVG
      if ( clazz->glyph_format == FT_GLYPH_FORMAT_SVG )
        render->render = clazz->render_glyph;
#endif

      /* add to list */
      node->data = module;
      FT_List_Add( &library->renderers, node );

      ft_set_current_renderer( library );
    }

  Fail:
    if ( error )
      FT_FREE( node );

  Exit:
    return error;
  }